

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Visit.hpp
# Opt level: O2

void mserialize::detail::visit_variant<Visitor,std::ifstream>
               (string_view full_tag,string_view tag,Visitor *visitor,
               basic_ifstream<char,_std::char_traits<char>_> *istream,int max_recursion)

{
  ulong uVar1;
  long lVar2;
  uint8_t uVar3;
  bool bVar4;
  string_view x;
  string_view y;
  uint8_t discriminator;
  string_view local_40;
  
  uVar1 = (ulong)(tag._len != 0);
  local_40._ptr = tag._ptr + uVar1;
  lVar2 = tag._len - uVar1;
  local_40._len = 0;
  if (lVar2 != 0) {
    local_40._len = lVar2 - 1;
  }
  TrivialDeserializer<unsigned_char>::deserialize<std::ifstream>(&discriminator,istream);
  uVar3 = discriminator;
  while (bVar4 = uVar3 != '\0', uVar3 = uVar3 + 0xff, bVar4) {
    tag_pop(&local_40);
  }
  x = tag_pop(&local_40);
  y._len = 1;
  y._ptr = "0";
  bVar4 = mserialize::operator==(x,y);
  if (!bVar4) {
    visit_impl<Visitor,std::ifstream>(full_tag,x,visitor,istream,max_recursion);
  }
  return;
}

Assistant:

void visit_variant(const string_view full_tag, string_view tag, Visitor& visitor, InputStream& istream, int max_recursion)
{
  tag.remove_prefix(1); // drop <
  tag.remove_suffix(1); // drop >

  std::uint8_t discriminator;
  mserialize::deserialize(discriminator, istream);

  std::uint8_t preceding_tag_count = discriminator;
  while (preceding_tag_count--) { tag_pop(tag); }

  const string_view option_tag = tag_pop(tag);

  const bool skip = visitor.visit(mserialize::Visitor::VariantBegin{discriminator, option_tag}, istream);
  if (skip) { return; }

  if (option_tag == "0")
  {
    visitor.visit(mserialize::Visitor::Null{});
  }
  else
  {
    visit_impl(full_tag, option_tag, visitor, istream, max_recursion);
  }

  visitor.visit(mserialize::Visitor::VariantEnd{});
}